

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void gen_tbl(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if ((((env->spr_cb[0x10c].name == (char *)0x0) && (env->spr[0x10c] == 0)) &&
      (env->spr_cb[0x10c].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[0x10c].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x10c].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[0x10c].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[0x10c].name = "TBL";
    env->spr_cb[0x10c].uea_read = spr_read_tbl;
    env->spr_cb[0x10c].uea_write = spr_noaccess;
    env->spr_cb[0x10c].oea_read = spr_read_tbl;
    env->spr_cb[0x10c].oea_write = spr_noaccess;
    env->spr_cb[0x10c].hea_read = spr_read_tbl;
    env->spr_cb[0x10c].hea_write = spr_noaccess;
    env->spr_cb[0x10c].default_value = 0;
    env->spr[0x10c] = 0;
    if (((env->spr_cb[0x11c].name == (char *)0x0) && (env->spr[0x11c] == 0)) &&
       ((env->spr_cb[0x11c].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x11c].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x11c].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x11c].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x11c].name = "TBL";
      env->spr_cb[0x11c].uea_read = spr_read_tbl;
      env->spr_cb[0x11c].uea_write = spr_noaccess;
      env->spr_cb[0x11c].oea_read = spr_read_tbl;
      env->spr_cb[0x11c].oea_write = spr_write_tbl;
      env->spr_cb[0x11c].hea_read = spr_read_tbl;
      env->spr_cb[0x11c].hea_write = spr_write_tbl;
      env->spr_cb[0x11c].default_value = 0;
      env->spr[0x11c] = 0;
      if (((env->spr_cb[0x10d].name == (char *)0x0) && (env->spr[0x10d] == 0)) &&
         (((env->spr_cb[0x10d].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
           ((env->spr_cb[0x10d].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
            (env->spr_cb[0x10d].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
          (env->spr_cb[0x10d].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
        env->spr_cb[0x10d].name = "TBU";
        env->spr_cb[0x10d].uea_read = spr_read_tbu;
        env->spr_cb[0x10d].uea_write = spr_noaccess;
        env->spr_cb[0x10d].oea_read = spr_read_tbu;
        env->spr_cb[0x10d].oea_write = spr_noaccess;
        env->spr_cb[0x10d].hea_read = spr_read_tbu;
        env->spr_cb[0x10d].hea_write = spr_noaccess;
        env->spr_cb[0x10d].default_value = 0;
        env->spr[0x10d] = 0;
        if (((((env->spr_cb[0x11d].name == (char *)0x0) && (env->spr[0x11d] == 0)) &&
             (env->spr_cb[0x11d].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
            ((env->spr_cb[0x11d].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
             (env->spr_cb[0x11d].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
           (env->spr_cb[0x11d].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
          env->spr_cb[0x11d].name = "TBU";
          env->spr_cb[0x11d].uea_read = spr_read_tbu;
          env->spr_cb[0x11d].uea_write = spr_noaccess;
          env->spr_cb[0x11d].oea_read = spr_read_tbu;
          env->spr_cb[0x11d].oea_write = spr_write_tbu;
          env->spr_cb[0x11d].hea_read = spr_read_tbu;
          env->spr_cb[0x11d].hea_write = spr_write_tbu;
          env->spr_cb[0x11d].default_value = 0;
          env->spr[0x11d] = 0;
          return;
        }
        uVar2 = 0x11d;
        uVar1 = 0x11d;
      }
      else {
        uVar2 = 0x10d;
        uVar1 = 0x10d;
      }
    }
    else {
      uVar2 = 0x11c;
      uVar1 = 0x11c;
    }
  }
  else {
    uVar2 = 0x10c;
    uVar1 = 0x10c;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void gen_tbl(CPUPPCState *env)
{
    spr_register(env, SPR_VTBL,  "TBL",
                 &spr_read_tbl, SPR_NOACCESS,
                 &spr_read_tbl, SPR_NOACCESS,
                 0x00000000);
    spr_register(env, SPR_TBL,   "TBL",
                 &spr_read_tbl, SPR_NOACCESS,
                 &spr_read_tbl, &spr_write_tbl,
                 0x00000000);
    spr_register(env, SPR_VTBU,  "TBU",
                 &spr_read_tbu, SPR_NOACCESS,
                 &spr_read_tbu, SPR_NOACCESS,
                 0x00000000);
    spr_register(env, SPR_TBU,   "TBU",
                 &spr_read_tbu, SPR_NOACCESS,
                 &spr_read_tbu, &spr_write_tbu,
                 0x00000000);
}